

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void av1_row_mt_sync_write(AV1EncRowMultiThreadSync *row_mt_sync,int r,int c,int cols)

{
  bool bVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  int sig;
  int cur;
  int nsync;
  int local_24;
  int local_1c;
  
  bVar1 = in_ECX + -1 <= in_EDX;
  local_1c = in_EDX;
  if (bVar1) {
    local_1c = in_ECX + (int)in_RDI[3] + *(int *)((long)in_RDI + 0x1c);
  }
  if (bVar1 || in_EDX % (int)in_RDI[3] == 0) {
    pthread_mutex_lock((pthread_mutex_t *)(*in_RDI + (long)in_ESI * 0x28));
    if (local_1c < *(int *)(in_RDI[2] + (long)in_ESI * 4)) {
      local_24 = *(int *)(in_RDI[2] + (long)in_ESI * 4);
    }
    else {
      local_24 = local_1c;
    }
    *(int *)(in_RDI[2] + (long)in_ESI * 4) = local_24;
    pthread_cond_signal((pthread_cond_t *)(in_RDI[1] + (long)in_ESI * 0x30));
    pthread_mutex_unlock((pthread_mutex_t *)(*in_RDI + (long)in_ESI * 0x28));
  }
  return;
}

Assistant:

void av1_row_mt_sync_write(AV1EncRowMultiThreadSync *row_mt_sync, int r, int c,
                           int cols) {
#if CONFIG_MULTITHREAD
  const int nsync = row_mt_sync->sync_range;
  int cur;
  // Only signal when there are enough encoded blocks for next row to run.
  int sig = 1;

  if (c < cols - 1) {
    cur = c;
    if (c % nsync) sig = 0;
  } else {
    cur = cols + nsync + row_mt_sync->intrabc_extra_top_right_sb_delay;
  }

  if (sig) {
    pthread_mutex_lock(&row_mt_sync->mutex_[r]);

    // When a thread encounters an error, num_finished_cols[r] is set to maximum
    // column number. In this case, the AOMMAX operation here ensures that
    // num_finished_cols[r] is not overwritten with a smaller value thus
    // preventing the infinite waiting of threads in the relevant sync_read()
    // function.
    row_mt_sync->num_finished_cols[r] =
        AOMMAX(row_mt_sync->num_finished_cols[r], cur);

    pthread_cond_signal(&row_mt_sync->cond_[r]);
    pthread_mutex_unlock(&row_mt_sync->mutex_[r]);
  }
#else
  (void)row_mt_sync;
  (void)r;
  (void)c;
  (void)cols;
#endif  // CONFIG_MULTITHREAD
}